

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O1

void __thiscall
Assimp::MDLImporter::ImportUVCoordinate_3DGS_MDL345
          (MDLImporter *this,aiVector3D *vOut,TexCoord_MDL3 *pcSrc,uint iIndex)

{
  uchar *puVar1;
  Logger *this_00;
  float fVar2;
  float fVar3;
  
  if (pcSrc != (TexCoord_MDL3 *)0x0) {
    puVar1 = this->mBuffer;
    if (*(uint *)(puVar1 + 0x48) <= iIndex) {
      iIndex = *(uint *)(puVar1 + 0x48) - 1;
      this_00 = DefaultLogger::get();
      Logger::warn(this_00,"Index overflow in MDLn UV coord list");
    }
    fVar2 = (float)(int)pcSrc[iIndex].u;
    fVar3 = (float)(int)pcSrc[iIndex].v;
    if (this->iGSFileVersion != 5) {
      fVar2 = (fVar2 + 0.5) / (float)*(int *)(puVar1 + 0x34);
      fVar3 = 1.0 - (fVar3 + 0.5) / (float)*(int *)(puVar1 + 0x38);
    }
    vOut->x = fVar2;
    vOut->y = fVar3;
    vOut->z = 0.0;
    return;
  }
  __assert_fail("__null != pcSrc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLLoader.cpp"
                ,0x314,
                "void Assimp::MDLImporter::ImportUVCoordinate_3DGS_MDL345(aiVector3D &, const MDL::TexCoord_MDL3 *, unsigned int)"
               );
}

Assistant:

void MDLImporter::ImportUVCoordinate_3DGS_MDL345(
    aiVector3D& vOut,
    const MDL::TexCoord_MDL3* pcSrc,
    unsigned int iIndex)
{
    ai_assert(NULL != pcSrc);
    const MDL::Header* const pcHeader = (const MDL::Header*)this->mBuffer;

    // validate UV indices
    if (iIndex >= (unsigned int) pcHeader->synctype)    {
        iIndex = pcHeader->synctype-1;
        ASSIMP_LOG_WARN("Index overflow in MDLn UV coord list");
    }

    float s = (float)pcSrc[iIndex].u;
    float t = (float)pcSrc[iIndex].v;

    // Scale s and t to range from 0.0 to 1.0
    if (0x5 != iGSFileVersion)  {
        s = (s + 0.5f)      / pcHeader->skinwidth;
        t = 1.0f-(t + 0.5f) / pcHeader->skinheight;
    }

    vOut.x = s;
    vOut.y = t;
    vOut.z = 0.0f;
}